

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O1

int MPIABI_Waitall(int count,MPIABI_Request *array_of_requests,MPIABI_Status *array_of_statuses)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  anon_union_24_2_44bf1552_for_mpi_status *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  int *piVar10;
  anon_union_24_2_44bf1552_for_mpi_status *paVar11;
  long lVar12;
  ulong uVar13;
  
  uVar13 = (ulong)(uint)count;
  if (0 < count && array_of_statuses != (MPIABI_Status *)0x0) {
    puVar9 = (undefined8 *)((long)&array_of_statuses->mpi_status + 0xc);
    lVar12 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&array_of_statuses->mpi_status + lVar12 + 0x14);
      uVar4 = *(undefined8 *)((long)&array_of_statuses->mpi_status + lVar12 + 0xc);
      uVar2 = *(undefined4 *)((long)&array_of_statuses->MPI_ERROR + lVar12);
      *(undefined8 *)((long)puVar9 + -0xc) =
           *(undefined8 *)((long)&array_of_statuses->MPI_SOURCE + lVar12);
      *(undefined4 *)((long)puVar9 + -4) = uVar2;
      *(undefined4 *)(puVar9 + 1) = uVar1;
      *puVar9 = uVar4;
      puVar9 = puVar9 + 3;
      lVar12 = lVar12 + 0x28;
    } while (uVar13 * 0x28 != lVar12);
  }
  iVar8 = MPI_Waitall(count,array_of_requests,array_of_statuses);
  if (0 < count && array_of_statuses != (MPIABI_Status *)0x0) {
    lVar12 = uVar13 + 1;
    piVar10 = &array_of_statuses[uVar13 - 1].MPI_ERROR;
    paVar5 = &array_of_statuses->mpi_status + uVar13;
    do {
      paVar11 = paVar5 + -1;
      uVar4 = *(undefined8 *)paVar11;
      iVar3 = *(int *)((long)paVar5 + -0x10);
      uVar6 = *(undefined8 *)paVar11;
      uVar7 = *(undefined8 *)((long)paVar5 + -0x10);
      *(undefined8 *)(piVar10 + -4) = *(undefined8 *)((long)paVar5 + -8);
      *(undefined8 *)&((MPIABI_Status *)(piVar10 + -8))->mpi_status = uVar6;
      *(undefined8 *)(piVar10 + -6) = uVar7;
      *(undefined8 *)(piVar10 + -2) = uVar4;
      *piVar10 = iVar3;
      lVar12 = lVar12 + -1;
      piVar10 = piVar10 + -10;
      paVar5 = paVar11;
    } while (1 < lVar12);
  }
  return iVar8;
}

Assistant:

int MPIABI_Waitall(int count, MPIABI_Request array_of_requests[],
                              MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < count; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < count; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr = MPI_Waitall(count, reqs, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = count - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = count - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}